

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O3

uint8_t get_per_atmid(CPUS390XState_conflict *env)

{
  uint uVar1;
  
  uVar1 = (uint)((ulong)env >> 0x20);
  return (byte)(uVar1 >> 0x16) & 0x10 |
         (byte)((ulong)env >> 0x1a) & 0x20 | (byte)((ulong)env >> 0x19) & 0x80 |
         (byte)(uVar1 >> 0xc) & 0xc | 0x40;
}

Assistant:

static inline uint8_t get_per_atmid(CPUS390XState *env)
{
    return ((env->psw.mask & PSW_MASK_64) ?       (1 << 7) : 0) |
                                                  (1 << 6)      |
           ((env->psw.mask & PSW_MASK_32) ?       (1 << 5) : 0) |
           ((env->psw.mask & PSW_MASK_DAT) ?      (1 << 4) : 0) |
           ((env->psw.mask & PSW_ASC_SECONDARY) ? (1 << 3) : 0) |
           ((env->psw.mask & PSW_ASC_ACCREG) ?    (1 << 2) : 0);
}